

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsc.c
# Opt level: O3

bsc_step_t
bsc_collective(bsc_step_t depends,bsc_collective_t *collective,bsc_pid_t root,bsc_group_t group,
              bsc_coll_params_t params)

{
  bsc_step_t bVar1;
  request_t *prVar2;
  long lVar3;
  bsc_step_t bVar4;
  
  if (collective->n_algs < 1) {
    bVar4 = 0;
  }
  else {
    lVar3 = 0;
    bVar4 = 0;
    do {
      bVar1 = (*collective->maxsteps[lVar3])(group);
      if (bVar4 <= bVar1) {
        bVar4 = bVar1;
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 < collective->n_algs);
  }
  prVar2 = new_request(depends);
  prVar2->kind = COLL;
  (prVar2->payload).coll.coll = collective;
  (prVar2->payload).coll.root = root;
  (prVar2->payload).exec.a0 = group;
  (prVar2->payload).exec.xs = params.src;
  (prVar2->payload).coll.params.dst = params.dst;
  (prVar2->payload).coll.params.tmp = params.tmp;
  (prVar2->payload).coll.params.reducer = params.reducer;
  (prVar2->payload).coll.params.zero = params.zero;
  *(bsc_size_t *)((long)&prVar2->payload + 0x40) = params.nmemb;
  *(bsc_size_t *)((long)&prVar2->payload + 0x44) = params.size;
  (prVar2->payload).coll.next = (coll_request *)0x0;
  return bVar4 + depends;
}

Assistant:

bsc_step_t bsc_collective( bsc_step_t depends,
       const bsc_collective_t * collective,
       bsc_pid_t root, bsc_group_t group, 
       bsc_coll_params_t params ) 
{
    request_t * req;
    coll_request_t r;
    bsc_step_t maxsteps = 0, steps;
    bsc_size_t i ;
    for ( i = 0; i < collective->n_algs; ++i ) 
    {
        steps = (*collective->maxsteps[i])( group );
        if ( maxsteps < steps )
            maxsteps = steps;
    }

    r.coll = collective;
    r.root = root;
    r.group = (group_t *) group;
    r.params = params;
    r.next = NULL;

    req = new_request( depends );
    req->kind = COLL;
    req->payload.coll = r;
    return depends + maxsteps;
}